

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ports.cpp
# Opt level: O1

bool port_is_enabled(Port *port,char *loc,size_t loc_size,Ports *base,void *runtime,
                    bool relative_to_parent,port_walker_t walker,void *data)

{
  uint8_t *name;
  long lVar1;
  uint8_t *puVar2;
  undefined8 __src;
  uint8_t *puVar3;
  Port *pPVar4;
  size_t sVar5;
  char *__s;
  char *pcVar6;
  uint8_t uVar7;
  int iVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *src;
  Ports *this;
  bool bVar14;
  char *dest;
  bool bVar15;
  char acStack_b0 [8];
  size_t sStack_a8;
  long lStack_a0;
  char acStack_98 [8];
  char acStack_90 [16];
  MetaContainer local_80;
  rtosc_arg_val_t rval;
  
  bVar14 = true;
  if (runtime != (void *)0x0 && port != (Port *)0x0) {
    pcVar13 = port->metadata;
    if ((pcVar13 != (char *)0x0) && (*pcVar13 == ':')) {
      pcVar13 = pcVar13 + 1;
    }
    builtin_strncpy(acStack_90,"\tn\x10",4);
    acStack_90[4] = '\0';
    acStack_90[5] = '\0';
    acStack_90[6] = '\0';
    acStack_90[7] = '\0';
    rtosc::Port::MetaContainer::MetaContainer(&local_80,pcVar13);
    builtin_strncpy(acStack_90,"\x1fn\x10",4);
    acStack_90[4] = '\0';
    acStack_90[5] = '\0';
    acStack_90[6] = '\0';
    acStack_90[7] = '\0';
    rval.val.b.data = (uint8_t *)rtosc::Port::MetaContainer::operator[](&local_80,"enabled by");
    if (rval.val.b.data != (uint8_t *)0x0) {
      name = (uint8_t *)port->name;
      uVar7 = *name;
      puVar3 = rval.val.b.data;
      puVar2 = name;
      if (uVar7 == '\0') {
        bVar15 = false;
      }
      else {
        do {
          if (((*puVar3 == '/') || (uVar7 == '/')) || (uVar7 != *puVar3)) break;
          puVar3 = puVar3 + 1;
          uVar7 = puVar2[1];
          puVar2 = puVar2 + 1;
        } while (uVar7 != '\0');
        bVar15 = uVar7 == '/';
      }
      bVar15 = (bool)(*puVar3 == '/' & bVar15);
      this = base;
      puVar2 = rval.val.b.data;
      if (bVar15) {
        acStack_90[0] = -99;
        acStack_90[1] = 'n';
        acStack_90[2] = '\x10';
        acStack_90[3] = '\0';
        acStack_90[4] = '\0';
        acStack_90[5] = '\0';
        acStack_90[6] = '\0';
        acStack_90[7] = '\0';
        pPVar4 = rtosc::Ports::operator[](base,(char *)name);
        this = pPVar4->ports;
        puVar2 = puVar3 + 1;
      }
      acStack_90[0] = -0x57;
      acStack_90[1] = 'n';
      acStack_90[2] = '\x10';
      acStack_90[3] = '\0';
      acStack_90[4] = '\0';
      acStack_90[5] = '\0';
      acStack_90[6] = '\0';
      acStack_90[7] = '\0';
      pPVar4 = rtosc::Ports::operator[](this,(char *)puVar2);
      acStack_90[0] = -0x47;
      acStack_90[1] = 'n';
      acStack_90[2] = '\x10';
      acStack_90[3] = '\0';
      acStack_90[4] = '\0';
      acStack_90[5] = '\0';
      acStack_90[6] = '\0';
      acStack_90[7] = '\0';
      sVar5 = strlen(loc);
      lVar1 = -(loc_size + 0xf & 0xfffffffffffffff0);
      pcVar13 = acStack_90 + lVar1 + 8;
      pcVar9 = acStack_90 + lVar1;
      pcVar9[0] = -0x24;
      pcVar9[1] = 'n';
      pcVar9[2] = '\x10';
      pcVar9[3] = '\0';
      pcVar9[4] = '\0';
      pcVar9[5] = '\0';
      pcVar9[6] = '\0';
      pcVar9[7] = '\0';
      strcpy(pcVar13,loc);
      iVar8 = (int)sVar5;
      if (relative_to_parent) {
        pcVar10 = acStack_90 + lVar1;
        pcVar10[0] = -6;
        pcVar10[1] = 'n';
        pcVar10[2] = '\x10';
        pcVar10[3] = '\0';
        pcVar10[4] = '\0';
        pcVar10[5] = '\0';
        pcVar10[6] = '\0';
        pcVar10[7] = '\0';
        strncat(pcVar13,"../",~(long)iVar8 + loc_size);
      }
      __src = rval.val.b.data;
      pcVar11 = acStack_90 + lVar1;
      builtin_strncpy(acStack_90 + lVar1,"\x17o\x10",4);
      pcVar11[4] = '\0';
      pcVar11[5] = '\0';
      pcVar11[6] = '\0';
      pcVar11[7] = '\0';
      strncat(pcVar13,(char *)__src,(loc_size - (long)iVar8) - 4);
      pcVar12 = acStack_90 + lVar1;
      builtin_strncpy(acStack_90 + lVar1,"\x1fo\x10",4);
      pcVar12[4] = '\0';
      pcVar12[5] = '\0';
      pcVar12[6] = '\0';
      pcVar12[7] = '\0';
      __s = rtosc::Ports::collapsePath(pcVar13);
      dest = pcVar13 + -((ulong)(pcVar13 + (loc_size - (long)__s) + 0xf) & 0xfffffffffffffff0);
      builtin_strncpy(acStack_90 +
                      -((ulong)(pcVar13 + (loc_size - (long)__s) + 0xf) & 0xfffffffffffffff0) +
                      lVar1,"Mo\x10",4);
      dest[-4] = '\0';
      dest[-3] = '\0';
      dest[-2] = '\0';
      dest[-1] = '\0';
      pcVar6 = strrchr(__s,0x2f);
      src = pcVar6 + 1;
      if (pcVar6 == (char *)0x0) {
        src = __s;
      }
      dest[-8] = 'c';
      dest[-7] = 'o';
      dest[-6] = '\x10';
      dest[-5] = '\0';
      dest[-4] = '\0';
      dest[-3] = '\0';
      dest[-2] = '\0';
      dest[-1] = '\0';
      fast_strcpy(dest,src,(size_t)(pcVar13 + (loc_size - (long)__s)));
      dest[-0x10] = '\0';
      dest[-0xf] = '\0';
      dest[-0xe] = '\0';
      dest[-0xd] = '\0';
      dest[-0xc] = '\0';
      dest[-0xb] = '\0';
      dest[-10] = '\0';
      dest[-9] = '\0';
      *(MetaContainer **)(dest + -0x18) = &local_80;
      dest[-0x20] = '\x01';
      dest[-0x1f] = '\0';
      dest[-0x1e] = '\0';
      dest[-0x1d] = '\0';
      dest[-0x1c] = '\0';
      dest[-0x1b] = '\0';
      dest[-0x1a] = '\0';
      dest[-0x19] = '\0';
      dest[-0x28] = -0x74;
      dest[-0x27] = 'o';
      dest[-0x26] = '\x10';
      dest[-0x25] = '\0';
      dest[-0x24] = '\0';
      dest[-0x23] = '\0';
      dest[-0x22] = '\0';
      dest[-0x21] = '\0';
      rtosc::helpers::get_value_from_runtime
                (runtime,pPVar4,(size_t)(pcVar13 + (loc_size - (long)__s)),__s,dest,0x2000,
                 *(size_t *)(dest + -0x20),*(rtosc_arg_val_t **)(dest + -0x18),
                 *(vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                   **)(dest + -0x10));
      bVar14 = (char)local_80.str_ptr == 'T' || rval._0_4_ != 0 && (char)local_80.str_ptr == 'i';
      if ((((bool)(bVar15 | !relative_to_parent)) && (walker != (port_walker_t)0x0)) &&
         ((char)local_80.str_ptr != 'T' && (rval._0_4_ == 0 || (char)local_80.str_ptr != 'i'))) {
        dest[-8] = -0x19;
        dest[-7] = 'o';
        dest[-6] = '\x10';
        dest[-5] = '\0';
        dest[-4] = '\0';
        dest[-3] = '\0';
        dest[-2] = '\0';
        dest[-1] = '\0';
        (*walker)(pPVar4,__s,pcVar13 + (long)iVar8 + 3,base,data,runtime);
      }
    }
  }
  return bVar14;
}

Assistant:

bool port_is_enabled(const Port* port, char* loc, size_t loc_size,
                     const Ports& base, void *runtime,
                     bool relative_to_parent,
                     port_walker_t walker, void* data)
{
    // TODO: this code should be improved
    if(port && runtime)
    {
        const char* enable_port = port->meta()["enabled by"];
        if(enable_port)
        {
            /*
                find out which Ports object to dispatch at
                (the current one or its child?)
             */
            const char* n = port->name;
            const char* e = enable_port;
            for( ; *n && (*n == *e) && *n != '/' && *e != '/'; ++n, ++e) ;

            bool subport = (*e == '/' && *n == '/');

            const char* ask_port_str = subport
                                       ? e+1
                                       : enable_port;

            const Ports& ask_ports = subport ? *base[port->name]->ports
                                             : base;

            assert(!strchr(ask_port_str, '/'));
            const Port* ask_port = ask_ports[ask_port_str];
            assert(ask_port);

            rtosc_arg_val_t rval;

            /*
                concatenate the location string
             */
            int loclen = strlen(loc);
            STACKALLOC(char, loc_copy, loc_size);
            strcpy(loc_copy, loc); // TODO: clang says strcpy is insecure
            if(relative_to_parent)
                strncat(loc_copy, "../", loc_size - loclen - 1);
            strncat(loc_copy, enable_port, loc_size - loclen - 3 - 1);

            char* collapsed_loc = Ports::collapsePath(loc_copy);
            loc_size -= (collapsed_loc - loc_copy);

            /*
                receive the "enabled" property
             */
            STACKALLOC(char, buf, loc_size);
            // TODO: pass a parameter portname_from_base, since Ports might
            //       also be of type a#N/b
            const char* last_slash = strrchr(collapsed_loc, '/');
            fast_strcpy(buf, last_slash ? last_slash + 1 : collapsed_loc,
                        loc_size); // TODO: bug: VoicePar#8/Enabled

            helpers::get_value_from_runtime(runtime,
                *ask_port, loc_size, collapsed_loc, buf,
                8192, 1, &rval, nullptr);
            assert(rval.type == 'T' || rval.type == 'F' || rval.type == 'i');

            bool res = rval.type == 'T' || (rval.type == 'i' && rval.val.i != 0);
            /*
             * If called from walk_ports, an enabling port must always be
             * traversed. However, if such a port resides inside a the port
             * which it currently disables, walk_ports would normally *not*
             * traverse it. So this allows still running walk_ports.
             */
            if (walker && !res && (subport || !relative_to_parent)) {
                // this makes some assumptions on how Ports::collapsePath works:
                // it starts at the end and keeps the string unchanged until the
                // first ".." - so we get:
                //    <loclen><4->
                //    /loc/abc/../enable
                //            abc/enable
                //
                const char* old_end = loc_copy + loclen + 3;
                walker(ask_port, collapsed_loc, old_end, base, data, runtime);
            }

            return res;
        }
        else // Port has no "enabled" property, so it is always enabled
            return true;
    }
    else // no runtime provided, so run statically through all subports
        return true;
}